

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

BUFFER_HANDLE constructDeviceOrModuleJson(IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  _Bool _Var1;
  JSON_Status JVar2;
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD IVar3;
  LOGGER_LOG p_Var4;
  JSON_Value *value;
  JSON_Object *object;
  uchar *source;
  size_t size;
  BUFFER_HANDLE handle;
  int iVar5;
  char *pcVar6;
  
  _Var1 = deviceOrModuleInfo->iotEdge_capable;
  if (deviceOrModuleInfo->deviceId == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",0x1c3,1,"Device id cannot be NULL");
    }
  }
  value = json_value_init_object();
  if (value == (JSON_Value *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_00136cfa:
      object = (JSON_Object *)0x0;
      goto LAB_00136cfd;
    }
    pcVar6 = "json_value_init_object failed";
    iVar5 = 0x1c8;
LAB_00136cf3:
    object = (JSON_Object *)0x0;
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"constructDeviceOrModuleJson",iVar5,1,pcVar6);
  }
  else {
    object = json_value_get_object(value);
    if (object == (JSON_Object *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfa;
      pcVar6 = "json_value_get_object failed";
      iVar5 = 0x1cd;
      goto LAB_00136cf3;
    }
    JVar2 = json_object_set_string(object,"deviceId",deviceOrModuleInfo->deviceId);
    if (JVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
      pcVar6 = "json_object_set_string failed for deviceId";
      iVar5 = 0x1d2;
LAB_00136c8a:
      handle = (BUFFER_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",iVar5,1,pcVar6);
      goto LAB_00136d00;
    }
    if (deviceOrModuleInfo->moduleId != (char *)0x0) {
      JVar2 = json_object_set_string(object,"moduleId",deviceOrModuleInfo->moduleId);
      if (JVar2 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
        pcVar6 = "json_object_set_string failed for moduleId";
        iVar5 = 0x1d7;
        goto LAB_00136c8a;
      }
    }
    if (deviceOrModuleInfo->managedBy != (char *)0x0) {
      JVar2 = json_object_set_string(object,"managedBy",deviceOrModuleInfo->managedBy);
      if (JVar2 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
        pcVar6 = "json_object_set_string failed for managedBy";
        iVar5 = 0x1dc;
        goto LAB_00136c8a;
      }
    }
    pcVar6 = "enabled";
    if (deviceOrModuleInfo->status == IOTHUB_DEVICE_STATUS_DISABLED) {
      pcVar6 = "disabled";
    }
    JVar2 = json_object_dotset_string(object,"status",pcVar6);
    if (JVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
      pcVar6 = "json_object_dotset_string failed for status";
      iVar5 = 0x1e1;
      goto LAB_00136c8a;
    }
    IVar3 = deviceOrModuleInfo->authMethod;
    if ((ulong)IVar3 < 4) {
      JVar2 = json_object_dotset_string
                        (object,"authentication.type",
                         &DAT_001874bc + *(int *)(&DAT_001874bc + (ulong)IVar3 * 4));
      if (JVar2 != 0) goto LAB_00136f51;
      IVar3 = deviceOrModuleInfo->authMethod;
      if (IVar3 == IOTHUB_REGISTRYMANAGER_AUTH_SPK) {
        JVar2 = json_object_dotset_string
                          (object,"authentication.symmetricKey.primaryKey",
                           deviceOrModuleInfo->primaryKey);
        if (JVar2 != 0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
          pcVar6 = "json_object_dotset_string failed for primarykey";
          iVar5 = 0x1ee;
          goto LAB_00136c8a;
        }
        IVar3 = deviceOrModuleInfo->authMethod;
        if (IVar3 == IOTHUB_REGISTRYMANAGER_AUTH_SPK) {
          JVar2 = json_object_dotset_string
                            (object,"authentication.symmetricKey.secondaryKey",
                             deviceOrModuleInfo->secondaryKey);
          if (JVar2 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
            pcVar6 = "json_object_dotset_string failed for secondaryKey";
            iVar5 = 499;
            goto LAB_00136c8a;
          }
          IVar3 = deviceOrModuleInfo->authMethod;
        }
      }
      if (IVar3 == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) {
        JVar2 = json_object_dotset_string
                          (object,"authentication.x509Thumbprint.primaryThumbprint",
                           deviceOrModuleInfo->primaryKey);
        if (JVar2 == 0) {
          if (deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) {
            JVar2 = json_object_dotset_string
                              (object,"authentication.x509Thumbprint.secondaryThumbprint",
                               deviceOrModuleInfo->secondaryKey);
            if (JVar2 != 0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00136cfd;
              pcVar6 = "json_object_dotset_string failed for secondaryThumbprint";
              iVar5 = 0x1fd;
              goto LAB_00136c8a;
            }
          }
          goto LAB_00137097;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar6 = "json_object_dotset_string failed for primaryThumbprint";
          iVar5 = 0x1f8;
          goto LAB_00136c8a;
        }
      }
      else {
LAB_00137097:
        if (deviceOrModuleInfo->moduleId == (char *)0x0) {
          JVar2 = json_object_dotset_boolean(object,"capabilities.iotEdge",(uint)_Var1);
          if (JVar2 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar6 = "json_object_dotset_string failed for iotEdge capable";
              iVar5 = 0x202;
              goto LAB_00136c8a;
            }
            goto LAB_00136cfd;
          }
        }
        source = (uchar *)json_serialize_to_string(value);
        if (source != (uchar *)0x0) {
          size = strlen((char *)source);
          handle = BUFFER_create(source,size);
          if (handle == (BUFFER_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"constructDeviceOrModuleJson",0x211,1,"Buffer_Create failed");
            }
          }
          json_free_serialized_string(source);
          goto LAB_00136d00;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar6 = "json_serialize_to_string failed";
          iVar5 = 0x20a;
          goto LAB_00136c8a;
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"getAuthTypeStringForJson",0x1a9,1,"Cannot map <%d> to auth type for JSON string"
                  ,IVar3);
      }
LAB_00136f51:
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar6 = "json_object_dotset_string failed for authType";
        iVar5 = 0x1e6;
        goto LAB_00136c8a;
      }
    }
  }
LAB_00136cfd:
  handle = (BUFFER_HANDLE)0x0;
LAB_00136d00:
  JVar2 = json_object_clear(object);
  if (JVar2 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",0x21a,1,"json_object_clear failed");
    }
    BUFFER_delete(handle);
    handle = (BUFFER_HANDLE)0x0;
  }
  if (value != (JSON_Value *)0x0) {
    json_value_free(value);
  }
  return handle;
}

Assistant:

static BUFFER_HANDLE constructDeviceOrModuleJson(const IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    BUFFER_HANDLE result;

    JSON_Value* root_value = NULL;
    JSON_Object* root_object = NULL;
    JSON_Status jsonStatus;

    const char *authTypeForJson;

    int iotEdge_capable = (deviceOrModuleInfo->iotEdge_capable == true) ? 1 : 0;

    if (deviceOrModuleInfo == NULL)
    {
        LogError("deviceOrModuleInfo cannot be null");
        result = NULL;
    }
    else if (deviceOrModuleInfo->deviceId == NULL)
    {
        LogError("Device id cannot be NULL");
        result = NULL;
    }
    if ((root_value = json_value_init_object()) == NULL)
    {
        LogError("json_value_init_object failed");
        result = NULL;
    }
    else if ((root_object = json_value_get_object(root_value)) == NULL)
    {
        LogError("json_value_get_object failed");
        result = NULL;
    }
    else if ((json_object_set_string(root_object, DEVICE_JSON_KEY_DEVICE_NAME, deviceOrModuleInfo->deviceId)) != JSONSuccess)
    {
        LogError("json_object_set_string failed for deviceId");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->moduleId != NULL) && ((json_object_set_string(root_object, DEVICE_JSON_KEY_MODULE_NAME, deviceOrModuleInfo->moduleId)) != JSONSuccess))
    {
        LogError("json_object_set_string failed for moduleId");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->managedBy != NULL) && ((json_object_set_string(root_object, DEVICE_JSON_KEY_MANAGED_BY, deviceOrModuleInfo->managedBy)) != JSONSuccess))
    {
        LogError("json_object_set_string failed for managedBy");
        result = NULL;
    }
    else if (json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_STATUS, getStatusStringForJson(deviceOrModuleInfo->status)) != JSONSuccess)
    {
        LogError("json_object_dotset_string failed for status");
        result = NULL;
    }
    else if ((NULL == (authTypeForJson = getAuthTypeStringForJson(deviceOrModuleInfo->authMethod))) || ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_AUTH_TYPE, authTypeForJson)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for authType");
        result = NULL;
    }
    //
    // Static function here.  We make the assumption that the auth method has been validated by the caller of this function.
    //
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_KEY, deviceOrModuleInfo->primaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for primarykey");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_KEY, deviceOrModuleInfo->secondaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for secondaryKey");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_THUMBPRINT, deviceOrModuleInfo->primaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for primaryThumbprint");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_THUMBPRINT, deviceOrModuleInfo->secondaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for secondaryThumbprint");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->moduleId == NULL) && (json_object_dotset_boolean(root_object, DEVICE_JSON_KEY_CAPABILITIES_IOTEDGE, iotEdge_capable)) != JSONSuccess)
    {
        LogError("json_object_dotset_string failed for iotEdge capable");
        result = NULL;
    }
    else
    {
        char* serialized_string;
        if ((serialized_string = json_serialize_to_string(root_value)) == NULL)
        {
            LogError("json_serialize_to_string failed");
            result = NULL;
        }
        else
        {
            if ((result = BUFFER_create((const unsigned char*)serialized_string, strlen(serialized_string))) == NULL)
            {
                LogError("Buffer_Create failed");
                result = NULL;
            }
            json_free_serialized_string(serialized_string);
        }
    }

    if ((jsonStatus = json_object_clear(root_object)) != JSONSuccess)
    {
        LogError("json_object_clear failed");
        BUFFER_delete(result);
        result = NULL;
    }
    if(root_value != NULL)
        json_value_free(root_value);

    return result;
}